

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_CCtxParams_registerSequenceProducer
               (ZSTD_CCtx_params *params,void *extSeqProdState,
               ZSTD_sequenceProducer_F extSeqProdFunc)

{
  if (extSeqProdFunc == (ZSTD_sequenceProducer_F)0x0) {
    extSeqProdState = (void *)0x0;
  }
  params->extSeqProdFunc = extSeqProdFunc;
  params->extSeqProdState = extSeqProdState;
  return;
}

Assistant:

void ZSTD_CCtxParams_registerSequenceProducer(
  ZSTD_CCtx_params* params,
  void* extSeqProdState,
  ZSTD_sequenceProducer_F extSeqProdFunc
) {
    assert(params != NULL);
    if (extSeqProdFunc != NULL) {
        params->extSeqProdFunc = extSeqProdFunc;
        params->extSeqProdState = extSeqProdState;
    } else {
        params->extSeqProdFunc = NULL;
        params->extSeqProdState = NULL;
    }
}